

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Statement * __thiscall soul::StructuralParser::parseIf(StructuralParser *this)

{
  bool bVar1;
  Expression *args_2;
  Block *args_3;
  IfStatement *pIVar2;
  bool isConst;
  pool_ptr<soul::AST::Statement> falseBranch;
  Context context;
  bool local_39;
  pool_ptr<soul::AST::Statement> local_38;
  Context local_30;
  
  getContext(&local_30,this);
  local_39 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
             ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c481a);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c8be9);
  args_2 = parseExpression(this,false);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c67cb);
  args_3 = parseStatementAsNewBlock(this);
  local_38.object = (Statement *)0x0;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a2a7c);
  if (bVar1) {
    local_38.object = &parseStatementAsNewBlock(this)->super_Statement;
  }
  pIVar2 = allocate<soul::AST::IfStatement,soul::AST::Context&,bool&,soul::AST::Expression&,soul::AST::Block&,soul::pool_ptr<soul::AST::Statement>&>
                     (this,&local_30,&local_39,args_2,args_3,&local_38);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_30);
  return &pIVar2->super_Statement;
}

Assistant:

AST::Statement& parseIf()
    {
        auto context = getContext();
        bool isConst = matchIf (Keyword::const_);
        expect (Operator::openParen);
        auto& condition = matchCloseParen (parseExpression());
        auto& trueBranch = parseStatementAsNewBlock();
        pool_ptr<AST::Statement> falseBranch;

        if (matchIf (Keyword::else_))
            falseBranch = parseStatementAsNewBlock();

        return allocate<AST::IfStatement> (context, isConst, condition, trueBranch, falseBranch);
    }